

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestMergeExceptionLite::~TestMergeExceptionLite(TestMergeExceptionLite *this)

{
  TestMergeExceptionLite *this_local;
  
  ~TestMergeExceptionLite(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestMergeExceptionLite::~TestMergeExceptionLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestMergeExceptionLite)
  SharedDtor(*this);
}